

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_string_ex(rf_font font,char *text,int text_len,rf_vec2 position,float font_size,
                      float spacing,rf_color tint)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  rf_int rVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  rf_rec source_rec;
  rf_rec dest_rec;
  rf_decoded_rune decoded_rune;
  float local_58;
  float fStack_54;
  rf_decoded_rune local_48;
  
  if (0 < text_len) {
    fVar11 = font_size / (float)font.base_size;
    fVar12 = 0.0;
    iVar4 = 0;
    lVar7 = 0;
    do {
      rf_decode_utf8_char(&local_48,text + lVar7,text_len - lVar7);
      lVar9 = -1;
      if (0 < font.glyphs_count) {
        lVar5 = 0;
        piVar6 = &(font.glyphs)->codepoint;
        rVar8 = font.glyphs_count;
        do {
          if (*piVar6 == local_48.codepoint) {
            lVar9 = lVar5 >> 0x20;
            break;
          }
          lVar5 = lVar5 + 0x100000000;
          piVar6 = piVar6 + 8;
          rVar8 = rVar8 + -1;
        } while (rVar8 != 0);
      }
      rVar8 = 1;
      if (local_48.codepoint == 0x3f) {
LAB_0014caf7:
        uVar2 = *(undefined8 *)((long)&font.glyphs[lVar9].field_0 + 8);
        local_58 = position.x;
        fStack_54 = position.y;
        uVar1 = font.glyphs[lVar9].offset_x;
        uVar3 = font.glyphs[lVar9].offset_y;
        dest_rec.x = (float)(int)uVar1 * fVar11 + fVar12 + local_58;
        dest_rec.y = (float)(int)uVar3 * fVar11 + (float)iVar4 + fStack_54;
        dest_rec.width = fVar11 * (float)uVar2;
        dest_rec.height = fVar11 * (float)((ulong)uVar2 >> 0x20);
        source_rec.width = (float)(int)uVar2;
        source_rec.height = (float)(int)((ulong)uVar2 >> 0x20);
        source_rec._0_8_ = *(undefined8 *)&font.glyphs[lVar9].field_0;
        rf_draw_texture_region(font.texture,source_rec,dest_rec,(rf_vec2)0x0,0.0,tint);
LAB_0014cb7e:
        if (font.glyphs[lVar9].advance_x == 0) {
          fVar10 = font.glyphs[lVar9].field_0.rec.width;
        }
        else {
          fVar10 = (float)font.glyphs[lVar9].advance_x;
        }
        fVar12 = fVar12 + fVar10 * fVar11 + spacing;
      }
      else {
        rVar8 = local_48.bytes_processed;
        if (local_48.codepoint == 0x20) goto LAB_0014cb7e;
        if (local_48.codepoint != 10) goto LAB_0014caf7;
        iVar4 = iVar4 + (int)((float)(font.base_size / 2 + font.base_size) * fVar11);
        fVar12 = 0.0;
      }
      lVar7 = lVar7 + rVar8;
    } while (lVar7 < text_len);
  }
  return;
}

Assistant:

RF_API void rf_draw_string_ex(rf_font font, const char* text, int text_len, rf_vec2 position, float font_size, float spacing, rf_color tint)
{
    int text_offset_y = 0; // Required for line break!
    float text_offset_x = 0.0f; // Offset between characters
    float scale_factor = 0.0f;

    int letter = 0; // Current character
    int index  = 0; // Index position in sprite font

    scale_factor = font_size / font.base_size;

    for (rf_int i = 0; i < text_len; i++)
    {
        rf_decoded_rune decoded_rune = rf_decode_utf8_char(&text[i], text_len - i);
        letter = decoded_rune.codepoint;
        index = rf_get_glyph_index(font, letter);

        // NOTE: Normally we exit the decoding sequence as soon as a bad unsigned char is found (and return 0x3f)
        // but we need to draw all of the bad bytes using the '?' symbol so to not skip any we set 'next = 1'
        if (letter == 0x3f) decoded_rune.bytes_processed = 1;
        i += (decoded_rune.bytes_processed - 1);

        if (letter == '\n')
        {
            // NOTE: Fixed line spacing of 1.5 lines
            text_offset_y += (int)((font.base_size + font.base_size/2)*scale_factor);
            text_offset_x = 0.0f;
        }
        else
        {
            if (letter != ' ')
            {
                rf_rec src_rec = font.glyphs[index].rec;
                rf_rec dst_rec = {  position.x + text_offset_x + font.glyphs[index].offset_x * scale_factor,
                                    position.y + text_offset_y + font.glyphs[index].offset_y * scale_factor,
                                    font.glyphs[index].width  * scale_factor,
                                    font.glyphs[index].height * scale_factor };
                rf_draw_texture_region(font.texture, src_rec, dst_rec, (rf_vec2){0}, 0.0f, tint);
            }

            if (font.glyphs[index].advance_x == 0) text_offset_x += ((float)font.glyphs[index].width * scale_factor + spacing);
            else text_offset_x += ((float)font.glyphs[index].advance_x * scale_factor + spacing);
        }
    }
}